

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O0

_Bool ssh_test_for_upstream(char *host,int port,Conf *conf)

{
  _Bool _Var1;
  int local_2c;
  _Bool ret;
  char *pcStack_28;
  int savedport;
  char *savedhost;
  Conf *conf_local;
  char *pcStack_10;
  int port_local;
  char *host_local;
  
  savedhost = (char *)conf;
  conf_local._4_4_ = port;
  pcStack_10 = host;
  random_ref();
  ssh_hostport_setup(pcStack_10,conf_local._4_4_,(Conf *)savedhost,&stack0xffffffffffffffd8,
                     &local_2c,(char **)0x0);
  _Var1 = ssh_share_test_for_upstream(pcStack_28,local_2c,(Conf *)savedhost);
  safefree(pcStack_28);
  random_unref();
  return _Var1;
}

Assistant:

static bool ssh_test_for_upstream(const char *host, int port, Conf *conf)
{
    char *savedhost;
    int savedport;
    bool ret;

    random_ref(); /* platform may need this to determine share socket name */
    ssh_hostport_setup(host, port, conf, &savedhost, &savedport, NULL);
    ret = ssh_share_test_for_upstream(savedhost, savedport, conf);
    sfree(savedhost);
    random_unref();

    return ret;
}